

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forest_device.cpp
# Opt level: O2

void embree::update_instance_transforms(void)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  if (g_use_instance_array) {
    rtcUpdateGeometryBuffer(instance_array,0x17,0);
    rtcCommitGeometry(instance_array);
    return;
  }
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < num_trees; uVar2 = uVar2 + 1) {
    rtcSetGeometryTransform(*(undefined8 *)(instances + uVar2 * 8),0,0x9244,DAT_002c6f00 + lVar1);
    rtcCommitGeometry(*(undefined8 *)(instances + uVar2 * 8));
    lVar1 = lVar1 + 0x40;
  }
  return;
}

Assistant:

void update_instance_transforms()
{
  if (g_use_instance_array)
  {
    rtcUpdateGeometryBuffer(instance_array, RTC_BUFFER_TYPE_TRANSFORM, 0);
    rtcCommitGeometry(instance_array);
  }
  else
  {
    for (unsigned int i = 0; i < num_trees; ++i) {
      rtcSetGeometryTransform(instances[i],0,RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR,(float*)&data.tree_transforms_host[i]);
      rtcCommitGeometry(instances[i]);
    }
  }
}